

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_mapper.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::PropertiesAffixPatternProvider::setTo
          (PropertiesAffixPatternProvider *this,DecimalFormatProperties *properties,
          UErrorCode *param_2)

{
  UBool UVar1;
  UnicodeString local_298;
  byte local_251;
  UnicodeString local_250;
  UnicodeString local_210;
  UnicodeString local_1d0;
  UnicodeString local_190;
  UnicodeString *local_150;
  UnicodeString *nsp;
  UnicodeString *npp;
  UnicodeString *psp;
  UnicodeString *ppp;
  UnicodeString nso;
  UnicodeString npo;
  undefined1 local_a0 [8];
  UnicodeString pso;
  UnicodeString ppo;
  UErrorCode *param_2_local;
  DecimalFormatProperties *properties_local;
  PropertiesAffixPatternProvider *this_local;
  
  this->fBogus = false;
  AffixUtils::escape((UnicodeString *)((long)&pso.fUnion + 0x30),&properties->positivePrefix);
  AffixUtils::escape((UnicodeString *)local_a0,&properties->positiveSuffix);
  AffixUtils::escape((UnicodeString *)((long)&nso.fUnion + 0x30),&properties->negativePrefix);
  AffixUtils::escape((UnicodeString *)&ppp,&properties->negativeSuffix);
  psp = &properties->positivePrefixPattern;
  npp = &properties->positiveSuffixPattern;
  nsp = &properties->negativePrefixPattern;
  local_150 = &properties->negativeSuffixPattern;
  UVar1 = icu_63::UnicodeString::isBogus(&properties->positivePrefix);
  if (UVar1 == '\0') {
    icu_63::UnicodeString::operator=(&this->posPrefix,(UnicodeString *)((long)&pso.fUnion + 0x30));
  }
  else {
    UVar1 = icu_63::UnicodeString::isBogus(psp);
    if (UVar1 == '\0') {
      icu_63::UnicodeString::operator=(&this->posPrefix,psp);
    }
    else {
      icu_63::UnicodeString::UnicodeString(&local_190,L"");
      icu_63::UnicodeString::operator=(&this->posPrefix,&local_190);
      icu_63::UnicodeString::~UnicodeString(&local_190);
    }
  }
  UVar1 = icu_63::UnicodeString::isBogus(&properties->positiveSuffix);
  if (UVar1 == '\0') {
    icu_63::UnicodeString::operator=(&this->posSuffix,(UnicodeString *)local_a0);
  }
  else {
    UVar1 = icu_63::UnicodeString::isBogus(npp);
    if (UVar1 == '\0') {
      icu_63::UnicodeString::operator=(&this->posSuffix,npp);
    }
    else {
      icu_63::UnicodeString::UnicodeString(&local_1d0,L"");
      icu_63::UnicodeString::operator=(&this->posSuffix,&local_1d0);
      icu_63::UnicodeString::~UnicodeString(&local_1d0);
    }
  }
  UVar1 = icu_63::UnicodeString::isBogus(&properties->negativePrefix);
  if (UVar1 == '\0') {
    icu_63::UnicodeString::operator=(&this->negPrefix,(UnicodeString *)((long)&nso.fUnion + 0x30));
  }
  else {
    UVar1 = icu_63::UnicodeString::isBogus(nsp);
    if (UVar1 == '\0') {
      icu_63::UnicodeString::operator=(&this->negPrefix,nsp);
    }
    else {
      local_251 = 0;
      UVar1 = icu_63::UnicodeString::isBogus(psp);
      if (UVar1 == '\0') {
        icu_63::UnicodeString::UnicodeString(&local_250,L"-");
        local_251 = 1;
        operator+(&local_210,&local_250,psp);
      }
      else {
        icu_63::UnicodeString::UnicodeString(&local_210,L"-");
      }
      icu_63::UnicodeString::operator=(&this->negPrefix,&local_210);
      icu_63::UnicodeString::~UnicodeString(&local_210);
      if ((local_251 & 1) != 0) {
        icu_63::UnicodeString::~UnicodeString(&local_250);
      }
    }
  }
  UVar1 = icu_63::UnicodeString::isBogus(&properties->negativeSuffix);
  if (UVar1 == '\0') {
    icu_63::UnicodeString::operator=(&this->negSuffix,(UnicodeString *)&ppp);
  }
  else {
    UVar1 = icu_63::UnicodeString::isBogus(local_150);
    if (UVar1 == '\0') {
      icu_63::UnicodeString::operator=(&this->negSuffix,local_150);
    }
    else {
      UVar1 = icu_63::UnicodeString::isBogus(npp);
      if (UVar1 == '\0') {
        icu_63::UnicodeString::UnicodeString(&local_298,npp);
      }
      else {
        icu_63::UnicodeString::UnicodeString(&local_298,L"");
      }
      icu_63::UnicodeString::operator=(&this->negSuffix,&local_298);
      icu_63::UnicodeString::~UnicodeString(&local_298);
    }
  }
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)&ppp);
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)((long)&nso.fUnion + 0x30));
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)local_a0);
  icu_63::UnicodeString::~UnicodeString((UnicodeString *)((long)&pso.fUnion + 0x30));
  return;
}

Assistant:

void PropertiesAffixPatternProvider::setTo(const DecimalFormatProperties& properties, UErrorCode&) {
    fBogus = false;

    // There are two ways to set affixes in DecimalFormat: via the pattern string (applyPattern), and via the
    // explicit setters (setPositivePrefix and friends).  The way to resolve the settings is as follows:
    //
    // 1) If the explicit setting is present for the field, use it.
    // 2) Otherwise, follows UTS 35 rules based on the pattern string.
    //
    // Importantly, the explicit setters affect only the one field they override.  If you set the positive
    // prefix, that should not affect the negative prefix.  Since it is impossible for the user of this class
    // to know whether the origin for a string was the override or the pattern, we have to say that we always
    // have a negative subpattern and perform all resolution logic here.

    // Convenience: Extract the properties into local variables.
    // Variables are named with three chars: [p/n][p/s][o/p]
    // [p/n] => p for positive, n for negative
    // [p/s] => p for prefix, s for suffix
    // [o/p] => o for escaped custom override string, p for pattern string
    UnicodeString ppo = AffixUtils::escape(properties.positivePrefix);
    UnicodeString pso = AffixUtils::escape(properties.positiveSuffix);
    UnicodeString npo = AffixUtils::escape(properties.negativePrefix);
    UnicodeString nso = AffixUtils::escape(properties.negativeSuffix);
    const UnicodeString& ppp = properties.positivePrefixPattern;
    const UnicodeString& psp = properties.positiveSuffixPattern;
    const UnicodeString& npp = properties.negativePrefixPattern;
    const UnicodeString& nsp = properties.negativeSuffixPattern;

    if (!properties.positivePrefix.isBogus()) {
        posPrefix = ppo;
    } else if (!ppp.isBogus()) {
        posPrefix = ppp;
    } else {
        // UTS 35: Default positive prefix is empty string.
        posPrefix = u"";
    }

    if (!properties.positiveSuffix.isBogus()) {
        posSuffix = pso;
    } else if (!psp.isBogus()) {
        posSuffix = psp;
    } else {
        // UTS 35: Default positive suffix is empty string.
        posSuffix = u"";
    }

    if (!properties.negativePrefix.isBogus()) {
        negPrefix = npo;
    } else if (!npp.isBogus()) {
        negPrefix = npp;
    } else {
        // UTS 35: Default negative prefix is "-" with positive prefix.
        // Important: We prepend the "-" to the pattern, not the override!
        negPrefix = ppp.isBogus() ? u"-" : u"-" + ppp;
    }

    if (!properties.negativeSuffix.isBogus()) {
        negSuffix = nso;
    } else if (!nsp.isBogus()) {
        negSuffix = nsp;
    } else {
        // UTS 35: Default negative prefix is the positive prefix.
        negSuffix = psp.isBogus() ? u"" : psp;
    }
}